

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::bc1_find_sels_2
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar7 = lr >> 2 | lr * 8;
  uVar4 = lg >> 4 | lg * 4;
  uVar2 = lb >> 2 | lb * 8;
  uVar8 = hr >> 2 | hr * 8;
  uVar10 = hg >> 4 | hg * 4;
  uVar12 = hb >> 2 | hb * 8;
  auVar18._8_8_ = (ulong)(uVar7 + uVar8 * 2) / 3 | (ulong)uVar8 << 0x20;
  auVar18._0_8_ = (ulong)uVar7 | (ulong)(uVar8 + uVar7 * 2) / 3 << 0x20;
  auVar19._8_8_ = (ulong)(uVar4 + uVar10 * 2) / 3 | (ulong)uVar10 << 0x20;
  auVar19._0_8_ = (ulong)uVar4 | (ulong)(uVar10 + uVar4 * 2) / 3 << 0x20;
  auVar23._8_8_ = (ulong)(uVar2 + uVar12 * 2) / 3 | (ulong)uVar12 << 0x20;
  auVar23._0_8_ = (ulong)uVar2 | (ulong)(uVar12 + uVar2 * 2) / 3 << 0x20;
  iVar9 = uVar8 - uVar7;
  iVar11 = uVar10 - uVar4;
  iVar13 = uVar12 - uVar2;
  auVar24._4_4_ = iVar9;
  auVar24._0_4_ = iVar9;
  auVar24._8_4_ = iVar9;
  auVar24._12_4_ = iVar9;
  auVar24 = pmulld(auVar24,auVar18);
  auVar21._4_4_ = iVar11;
  auVar21._0_4_ = iVar11;
  auVar21._8_4_ = iVar11;
  auVar21._12_4_ = iVar11;
  auVar18 = pmulld(auVar21,auVar19);
  auVar20._4_4_ = iVar13;
  auVar20._0_4_ = iVar13;
  auVar20._8_4_ = iVar13;
  auVar20._12_4_ = iVar13;
  auVar21 = pmulld(auVar20,auVar23);
  auVar22._0_4_ = auVar21._0_4_ + auVar18._0_4_ + auVar24._0_4_;
  auVar22._4_4_ = auVar21._4_4_ + auVar18._4_4_ + auVar24._4_4_;
  auVar22._8_4_ = auVar21._8_4_ + auVar18._8_4_ + auVar24._8_4_;
  auVar22._12_4_ = auVar21._12_4_ + auVar18._12_4_ + auVar24._12_4_;
  auVar18 = phaddd(auVar22,auVar22);
  iVar5 = auVar18._0_4_;
  iVar3 = auVar22._8_4_ + auVar22._4_4_;
  iVar1 = auVar18._4_4_;
  iVar9 = iVar9 * 2;
  iVar11 = iVar11 * 2;
  iVar13 = iVar13 * 2;
  uVar14 = 0xfffffffffffffffc;
  do {
    iVar16 = (uint)pSrc_pixels[uVar14 + 4].field_0.field_0.b * iVar13 +
             (uint)pSrc_pixels[uVar14 + 4].field_0.field_0.g * iVar11 +
             (uint)pSrc_pixels[uVar14 + 4].field_0.field_0.r * iVar9;
    iVar15 = (uint)pSrc_pixels[uVar14 + 5].field_0.field_0.b * iVar13 +
             (uint)pSrc_pixels[uVar14 + 5].field_0.field_0.g * iVar11 +
             (uint)pSrc_pixels[uVar14 + 5].field_0.field_0.r * iVar9;
    iVar17 = (uint)pSrc_pixels[uVar14 + 6].field_0.field_0.b * iVar13 +
             (uint)pSrc_pixels[uVar14 + 6].field_0.field_0.g * iVar11 +
             (uint)pSrc_pixels[uVar14 + 6].field_0.field_0.r * iVar9;
    iVar6 = (uint)pSrc_pixels[uVar14 + 7].field_0.field_0.b * iVar13 +
            (uint)pSrc_pixels[uVar14 + 7].field_0.field_0.g * iVar11 +
            (uint)pSrc_pixels[uVar14 + 7].field_0.field_0.r * iVar9;
    sels[uVar14 + 4] =
         "\x03\x02\x01"
         [(ulong)(iVar16 < iVar1) + (ulong)(iVar16 < iVar3) + (ulong)(iVar16 <= iVar5)];
    sels[uVar14 + 5] =
         "\x03\x02\x01"
         [(ulong)(iVar15 < iVar1) + (ulong)(iVar15 < iVar3) + (ulong)(iVar15 <= iVar5)];
    sels[uVar14 + 6] =
         "\x03\x02\x01"
         [(ulong)(iVar17 < iVar1) + (ulong)(iVar17 < iVar3) + (ulong)(iVar17 <= iVar5)];
    sels[uVar14 + 7] =
         "\x03\x02\x01"[(ulong)(iVar6 < iVar1) + (ulong)(iVar6 < iVar3) + (ulong)(iVar6 <= iVar5)];
    uVar14 = uVar14 + 4;
  } while (uVar14 < 0xc);
  return;
}

Assistant:

static inline void bc1_find_sels_2(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];

		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);
		block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
		block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}